

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertFromStruct
          (ElementsDecodeRawTransactionTxIn *this,ElementsDecodeRawTransactionTxInStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->coinbase_);
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  ElementsDecodeUnlockingScript::ConvertFromStruct(&this->script_sig_,&data->script_sig);
  this->is_pegin_ = data->is_pegin;
  this->sequence_ = data->sequence;
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->txinwitness_,&data->txinwitness);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->pegin_witness_,&data->pegin_witness);
  ElementsDecodeIssuance::ConvertFromStruct(&this->issuance_,&data->issuance);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxIn::ConvertFromStruct(
    const ElementsDecodeRawTransactionTxInStruct& data) {
  coinbase_ = data.coinbase;
  txid_ = data.txid;
  vout_ = data.vout;
  script_sig_.ConvertFromStruct(data.script_sig);
  is_pegin_ = data.is_pegin;
  sequence_ = data.sequence;
  txinwitness_.ConvertFromStruct(data.txinwitness);
  pegin_witness_.ConvertFromStruct(data.pegin_witness);
  issuance_.ConvertFromStruct(data.issuance);
  ignore_items = data.ignore_items;
}